

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O2

void __thiscall
GdlSlotRefExpression::GenerateEngineCode
          (GdlSlotRefExpression *this,uint32_t param_1,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbOutput,int iritCurrent,
          vector<int,_std::allocator<int>_> *pviritInput,int param_5,bool param_6,int param_7,
          int *pnValue)

{
  int iVar1;
  sdata8 offset8;
  uchar local_12;
  value_type_conflict4 local_11;
  
  iVar1 = this->m_nIOIndex;
  if (pviritInput != (vector<int,_std::allocator<int>_> *)0x0) {
    iVar1 = (pviritInput->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar1];
  }
  *pnValue = iVar1 - iritCurrent;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (vbOutput,&local_12);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(vbOutput,&local_11);
  return;
}

Assistant:

void GdlSlotRefExpression::GenerateEngineCode(uint32_t /*fxdRuleVersion*/, std::vector<gr::byte> & vbOutput,
	int iritCurrent, std::vector<int> * pviritInput, int /*nIIndex*/,
	bool /*fAttachAt*/, int /*iritAttachTo*/, int * pnValue)
{
	int nOffset = m_nIOIndex - iritCurrent;

	Assert(!pviritInput);	// should not be used for constraints
	if (pviritInput)
		nOffset = (*pviritInput)[m_nIOIndex] - iritCurrent;

	Assert(-128 <= nOffset && nOffset < 128); // Check this fits in 8 bits.
	gr::sdata8 const offset8 = nOffset;
	//	If this happens to be the value of an attach.to attribute, current or following
	//	slot needs to have insert = false set.
	*pnValue = nOffset;

	vbOutput.push_back(kopPushByte);
	vbOutput.push_back(reinterpret_cast<gr::byte const &>(offset8));
}